

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_connective.c
# Opt level: O0

void route_anything(t_route *x,t_symbol *sel,int argc,t_atom *argv)

{
  int local_34;
  t_routeelement *ptStack_30;
  int nelement;
  t_routeelement *e;
  t_atom *argv_local;
  int argc_local;
  t_symbol *sel_local;
  t_route *x_local;
  
  if (x->x_type == A_SYMBOL) {
    ptStack_30 = x->x_vec;
    local_34 = x->x_nelement;
    while (local_34 != 0) {
      if ((ptStack_30->e_w).w_symbol == sel) {
        if ((0 < argc) && (argv->a_type == A_SYMBOL)) {
          outlet_anything(ptStack_30->e_outlet,(argv->a_w).w_symbol,argc + -1,argv + 1);
          return;
        }
        outlet_list(ptStack_30->e_outlet,(t_symbol *)0x0,argc,argv);
        return;
      }
      ptStack_30 = ptStack_30 + 1;
      local_34 = local_34 + -1;
    }
  }
  outlet_anything(x->x_rejectout,sel,argc,argv);
  return;
}

Assistant:

static void route_anything(t_route *x, t_symbol *sel, int argc, t_atom *argv)
{
    t_routeelement *e;
    int nelement;
    if (x->x_type == A_SYMBOL)
    {
        for (nelement = x->x_nelement, e = x->x_vec; nelement--; e++)
            if (e->e_w.w_symbol == sel)
        {
            if (argc > 0 && argv[0].a_type == A_SYMBOL)
                outlet_anything(e->e_outlet, argv[0].a_w.w_symbol,
                    argc-1, argv+1);
            else outlet_list(e->e_outlet, 0, argc, argv);
            return;
        }
    }
    outlet_anything(x->x_rejectout, sel, argc, argv);
}